

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void __thiscall
mxx::custom_op<unsigned_short,true>::custom_op<std::logical_and<unsigned_short>>
          (custom_op<unsigned_short,true> *this)

{
  datatype dt;
  int local_1c;
  
  *(undefined ***)this = &PTR__custom_op_00165020;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<unsigned_short,true>)0x0;
  this[0x28] = (custom_op<unsigned_short,true>)0x1;
  *(undefined **)(this + 0x38) = &ompi_mpi_op_land;
  dt._vptr_datatype = (_func_int **)&PTR__datatype_00164cf0;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_short;
  dt.builtin = true;
  *(undefined **)(this + 0x30) = &ompi_mpi_unsigned_short;
  datatype::~datatype(&dt);
  if (((byte)this[0x28] & 1) == 0) {
    dt._vptr_datatype = (_func_int **)custom_function<std::logical_and<unsigned_short>>;
    std::function<void(void*,void*,int*)>::operator=
              ((function<void(void*,void*,int*)> *)(this + 8),
               (_Bind<void_(*(std::logical_and<unsigned_short>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(std::logical_and<unsigned_short>,_void_*,_void_*,_int_*)>
                *)&dt);
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00164cf0;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_short;
    dt.builtin = true;
    MPI_Type_dup(&ompi_mpi_unsigned_short,this + 0x30);
    local_1c = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
              ((MPI_Datatype *)(this + 0x30),&local_1c,
               (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
    MPI_Op_create(custom_op<unsigned_short,_true>::mpi_user_function,1,this + 0x38);
    datatype::~datatype(&dt);
  }
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }